

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_list.c
# Opt level: O0

int cmime_list_new(CMimeList_T **list,_func_void_void_ptr *destroy)

{
  CMimeList_T *pCVar1;
  _func_void_void_ptr *destroy_local;
  CMimeList_T **list_local;
  
  pCVar1 = (CMimeList_T *)calloc(1,0x20);
  *list = pCVar1;
  if (*list == (CMimeList_T *)0x0) {
    list_local._4_4_ = -1;
  }
  else {
    (*list)->size = 0;
    (*list)->head = (CMimeListElem_T *)0x0;
    (*list)->tail = (CMimeListElem_T *)0x0;
    (*list)->destroy = destroy;
    list_local._4_4_ = 0;
  }
  return list_local._4_4_;
}

Assistant:

int cmime_list_new(CMimeList_T **list, void (*destroy)(void *data)) {
    (*list) = (CMimeList_T *)calloc((size_t)1,sizeof(CMimeList_T));
    
    if(*list == NULL) {
        return(-1);
    }

    (*list)->size = 0;
    (*list)->head = NULL;
    (*list)->tail = NULL;
    (*list)->destroy = destroy;

    return(0);
}